

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_entityboss.cpp
# Opt level: O1

int AF_A_EntityAttack(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  AActor *self;
  undefined8 *puVar2;
  PClass *pPVar3;
  int iVar4;
  uint uVar5;
  undefined4 extraout_var;
  undefined8 uVar6;
  PClass *pPVar7;
  FString *pFVar8;
  VMValue *pVVar9;
  char *pcVar10;
  long lVar11;
  bool bVar12;
  VMValue params [3];
  anon_union_16_5_cf148060_for_VMValue_0 local_68;
  AActor *local_58;
  undefined4 local_50;
  undefined1 local_4c;
  FString local_48;
  undefined4 local_40;
  char local_3c [12];
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar10 = "(paramnum) < numparam";
    goto LAB_005cc255;
  }
  if (((param->field_0).field_3.Type == '\x03') &&
     (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
    self = (AActor *)(param->field_0).field_1.a;
    pVVar9 = param;
    uVar5 = numparam;
    if (self != (AActor *)0x0) {
      if ((self->super_DThinker).super_DObject.Class == (PClass *)0x0) {
        iVar4 = (**(self->super_DThinker).super_DObject._vptr_DObject)(self);
        (self->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar4);
      }
      pPVar7 = (self->super_DThinker).super_DObject.Class;
      bVar12 = pPVar7 == (PClass *)0x0;
      ret = (VMReturn *)(ulong)!bVar12;
      uVar5 = (uint)bVar12;
      pVVar9 = (VMValue *)(ulong)(pPVar7 == pPVar3 || bVar12);
      if (pPVar7 != pPVar3 && !bVar12) {
        do {
          pPVar7 = pPVar7->ParentClass;
          ret = (VMReturn *)(ulong)(pPVar7 != (PClass *)0x0);
          if (pPVar7 == pPVar3) break;
        } while (pPVar7 != (PClass *)0x0);
      }
      if ((char)ret == '\0') {
        pcVar10 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_005cc255;
      }
    }
    pPVar3 = AActor::RegistrationInfo.MyClass;
    if ((numparam != 1) && (VVar1 = param[1].field_0.field_3.Type, VVar1 != 0xff)) {
      if ((VVar1 != '\x03') ||
         ((param[1].field_0.field_1.atag != 1 && (param[1].field_0.field_1.a != (void *)0x0))))
      goto LAB_005cc22a;
      puVar2 = (undefined8 *)param[1].field_0.field_1.a;
      if (puVar2 != (undefined8 *)0x0) {
        if (puVar2[1] == 0) {
          uVar6 = (**(code **)*puVar2)(puVar2,pVVar9,uVar5,ret);
          puVar2[1] = uVar6;
        }
        pPVar7 = (PClass *)puVar2[1];
        bVar12 = pPVar7 != (PClass *)0x0;
        if (pPVar7 != pPVar3 && bVar12) {
          do {
            pPVar7 = pPVar7->ParentClass;
            bVar12 = pPVar7 != (PClass *)0x0;
            if (pPVar7 == pPVar3) break;
          } while (pPVar7 != (PClass *)0x0);
        }
        if (!bVar12) {
          pcVar10 = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005cc255;
        }
      }
    }
    if (((numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
       ((VVar1 == '\x03' &&
        ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
      uVar5 = FRandom::GenRand32(&pr_entity);
      local_68.field_1.a = self;
      local_58 = self;
      switch(uVar5 & 0xff) {
      default:
        local_68.field_1.atag = 1;
        local_68.field_3.Type = '\x03';
        local_50 = 1;
        local_4c = 3;
        local_48.Chars = (char *)0x0;
        local_40 = 8;
        local_3c[0] = 3;
        VMFrameStack::Call(stack,&A_SpotLightning_VMPtr->super_VMFunction,
                           (VMValue *)&local_68.field_1,3,(VMReturn *)0x0,0,(VMException **)0x0);
        lVar11 = -0x30;
        pFVar8 = &local_48;
        do {
          if (*(char *)((long)&pFVar8[1].Chars + 4) == '\x02') {
            FString::~FString(pFVar8);
          }
          pFVar8 = pFVar8 + -2;
          lVar11 = lVar11 + 0x10;
        } while (lVar11 != 0);
        return 0;
      case 1:
      case 6:
      case 0xb:
      case 0x10:
      case 0x15:
      case 0x1a:
      case 0x1f:
      case 0x24:
      case 0x29:
      case 0x2e:
      case 0x33:
      case 0x38:
      case 0x3d:
      case 0x42:
      case 0x47:
      case 0x4c:
      case 0x51:
      case 0x56:
      case 0x5b:
      case 0x60:
      case 0x65:
      case 0x6a:
      case 0x6f:
      case 0x74:
      case 0x79:
      case 0x7e:
      case 0x83:
      case 0x88:
      case 0x8d:
      case 0x92:
      case 0x97:
      case 0x9c:
      case 0xa1:
      case 0xa6:
      case 0xab:
      case 0xb0:
      case 0xb5:
      case 0xba:
      case 0xbf:
      case 0xc4:
      case 0xc9:
      case 0xce:
      case 0xd3:
      case 0xd8:
      case 0xdd:
      case 0xe2:
      case 0xe7:
      case 0xec:
      case 0xf1:
      case 0xf6:
      case 0xfb:
        pcVar10 = "SpectralLightningBigBall2";
        break;
      case 2:
      case 7:
      case 0xc:
      case 0x11:
      case 0x16:
      case 0x1b:
      case 0x20:
      case 0x25:
      case 0x2a:
      case 0x2f:
      case 0x34:
      case 0x39:
      case 0x3e:
      case 0x43:
      case 0x48:
      case 0x4d:
      case 0x52:
      case 0x57:
      case 0x5c:
      case 0x61:
      case 0x66:
      case 0x6b:
      case 0x70:
      case 0x75:
      case 0x7a:
      case 0x7f:
      case 0x84:
      case 0x89:
      case 0x8e:
      case 0x93:
      case 0x98:
      case 0x9d:
      case 0xa2:
      case 0xa7:
      case 0xac:
      case 0xb1:
      case 0xb6:
      case 0xbb:
      case 0xc0:
      case 0xc5:
      case 0xca:
      case 0xcf:
      case 0xd4:
      case 0xd9:
      case 0xde:
      case 0xe3:
      case 0xe8:
      case 0xed:
      case 0xf2:
      case 0xf7:
      case 0xfc:
        pcVar10 = "SpectralLightningH3";
        break;
      case 3:
      case 8:
      case 0xd:
      case 0x12:
      case 0x17:
      case 0x1c:
      case 0x21:
      case 0x26:
      case 0x2b:
      case 0x30:
      case 0x35:
      case 0x3a:
      case 0x3f:
      case 0x44:
      case 0x49:
      case 0x4e:
      case 0x53:
      case 0x58:
      case 0x5d:
      case 0x62:
      case 0x67:
      case 0x6c:
      case 0x71:
      case 0x76:
      case 0x7b:
      case 0x80:
      case 0x85:
      case 0x8a:
      case 0x8f:
      case 0x94:
      case 0x99:
      case 0x9e:
      case 0xa3:
      case 0xa8:
      case 0xad:
      case 0xb2:
      case 0xb7:
      case 0xbc:
      case 0xc1:
      case 0xc6:
      case 0xcb:
      case 0xd0:
      case 0xd5:
      case 0xda:
      case 0xdf:
      case 0xe4:
      case 0xe9:
      case 0xee:
      case 0xf3:
      case 0xf8:
      case 0xfd:
        local_68.field_1.atag = 1;
        local_68.field_3.Type = '\x03';
        local_50 = 1;
        local_4c = 3;
        local_48.Chars = (char *)0x0;
        local_40 = 8;
        local_3c[0] = 3;
        VMFrameStack::Call(stack,&A_Spectre3Attack_VMPtr->super_VMFunction,
                           (VMValue *)&local_68.field_1,3,(VMReturn *)0x0,0,(VMException **)0x0);
        lVar11 = -0x30;
        pFVar8 = &local_48;
        do {
          if (*(char *)((long)&pFVar8[1].Chars + 4) == '\x02') {
            FString::~FString(pFVar8);
          }
          pFVar8 = pFVar8 + -2;
          lVar11 = lVar11 + 0x10;
        } while (lVar11 != 0);
        return 0;
      case 4:
      case 9:
      case 0xe:
      case 0x13:
      case 0x18:
      case 0x1d:
      case 0x22:
      case 0x27:
      case 0x2c:
      case 0x31:
      case 0x36:
      case 0x3b:
      case 0x40:
      case 0x45:
      case 0x4a:
      case 0x4f:
      case 0x54:
      case 0x59:
      case 0x5e:
      case 99:
      case 0x68:
      case 0x6d:
      case 0x72:
      case 0x77:
      case 0x7c:
      case 0x81:
      case 0x86:
      case 0x8b:
      case 0x90:
      case 0x95:
      case 0x9a:
      case 0x9f:
      case 0xa4:
      case 0xa9:
      case 0xae:
      case 0xb3:
      case 0xb8:
      case 0xbd:
      case 0xc2:
      case 199:
      case 0xcc:
      case 0xd1:
      case 0xd6:
      case 0xdb:
      case 0xe0:
      case 0xe5:
      case 0xea:
      case 0xef:
      case 0xf4:
      case 0xf9:
      case 0xfe:
        pcVar10 = "SpectralLightningBigV2";
      }
      A_SpectralMissile(self,pcVar10);
      return 0;
    }
    pcVar10 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
    ;
  }
  else {
LAB_005cc22a:
    pcVar10 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_005cc255:
  __assert_fail(pcVar10,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_entityboss.cpp"
                ,0x2d,"int AF_A_EntityAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_EntityAttack)
{
	PARAM_ACTION_PROLOGUE;

	// Apparent Strife bug: Case 5 was unreachable because they used % 5 instead of % 6.
	// I've fixed that by making case 1 duplicate it, since case 1 did nothing.
	switch (pr_entity() % 5)
	{
	case 0:
		CALL_ACTION(A_SpotLightning, self);
		break;

	case 2:
		A_SpectralMissile (self, "SpectralLightningH3");
		break;

	case 3:
		CALL_ACTION(A_Spectre3Attack, self);
		break;

	case 4:
		A_SpectralMissile (self, "SpectralLightningBigV2");
		break;

	case 1:
	case 5:
		A_SpectralMissile (self, "SpectralLightningBigBall2");
		break;
	}
	return 0;
}